

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O2

void unbiasnet(nn_quant *nnq)

{
  ulong uVar1;
  ulong uVar2;
  nq_pixel *paiVar3;
  long lVar4;
  int iVar5;
  
  paiVar3 = nnq->network;
  uVar2 = 0;
  uVar1 = (ulong)(uint)nnq->netsize;
  if (nnq->netsize < 1) {
    uVar1 = uVar2;
  }
  for (; uVar2 != uVar1; uVar2 = uVar2 + 1) {
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      iVar5 = (*paiVar3)[lVar4] + 8 >> 4;
      if (0xfe < iVar5) {
        iVar5 = 0xff;
      }
      (*paiVar3)[lVar4] = iVar5;
    }
    nnq->network[uVar2][4] = (int)uVar2;
    paiVar3 = paiVar3 + 1;
  }
  return;
}

Assistant:

void unbiasnet(nn_quant *nnq)
{
	int i,j,temp;

	for (i=0; i < nnq->netsize; i++) {
		for (j=0; j<4; j++) {
			/* OLD CODE: network[i][j] >>= netbiasshift; */
			/* Fix based on bug report by Juergen Weigert jw@suse.de */
			temp = (nnq->network[i][j] + (1 << (netbiasshift - 1))) >> netbiasshift;
			if (temp > 255) temp = 255;
			nnq->network[i][j] = temp;
		}
		nnq->network[i][4] = i;			/* record colour no */
	}
}